

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildSetupFont
               (ImFontAtlas *atlas,ImFont *font,ImFontConfig *font_config,float ascent,float descent
               )

{
  float descent_local;
  float ascent_local;
  ImFontConfig *font_config_local;
  ImFont *font_local;
  ImFontAtlas *atlas_local;
  
  if ((font_config->MergeMode & 1U) == 0) {
    font->ContainerAtlas = atlas;
    font->ConfigData = font_config;
    font->ConfigDataCount = 0;
    font->FontSize = font_config->SizePixels;
    font->Ascent = ascent;
    font->Descent = descent;
    ImVector<ImFont::Glyph>::resize(&font->Glyphs,0);
    font->MetricsTotalSurface = 0;
  }
  font->ConfigDataCount = font->ConfigDataCount + 1;
  return;
}

Assistant:

void ImFontAtlasBuildSetupFont(ImFontAtlas* atlas, ImFont* font, ImFontConfig* font_config, float ascent, float descent)
{
    if (!font_config->MergeMode)
    {
        font->ContainerAtlas = atlas;
        font->ConfigData = font_config;
        font->ConfigDataCount = 0;
        font->FontSize = font_config->SizePixels;
        font->Ascent = ascent;
        font->Descent = descent;
        font->Glyphs.resize(0);
        font->MetricsTotalSurface = 0;
    }
    font->ConfigDataCount++;
}